

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageHLine(gdImagePtr im,int y,int x1,int x2,int col)

{
  int iVar1;
  int t;
  int thickhalf;
  int col_local;
  int x2_local;
  int x1_local;
  int y_local;
  gdImagePtr im_local;
  
  if (im->thick < 2) {
    col_local = x1;
    thickhalf = x2;
    if (x2 < x1) {
      col_local = x2;
      thickhalf = x1;
    }
    for (; col_local <= thickhalf; col_local = col_local + 1) {
      gdImageSetPixel(im,col_local,y,col);
    }
  }
  else {
    iVar1 = im->thick >> 1;
    _gdImageFilledHRectangle(im,x1,y - iVar1,x2,((y + im->thick) - iVar1) + -1,col);
  }
  return;
}

Assistant:

static void gdImageHLine(gdImagePtr im, int y, int x1, int x2, int col)
{
	if (im->thick > 1) {
		int thickhalf = im->thick >> 1;
		_gdImageFilledHRectangle(im, x1, y - thickhalf, x2, y + im->thick - thickhalf - 1, col);
	} else {
		if (x2 < x1) {
			int t = x2;
			x2 = x1;
			x1 = t;
		}

		for (; x1 <= x2; x1++) {
			gdImageSetPixel(im, x1, y, col);
		}
	}
	return;
}